

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O3

void __thiscall
webfront::
BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
::addScript(BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
            *this,string_view script)

{
  mapped_type *this_00;
  key_type local_28;
  undefined1 local_26;
  undefined1 local_25;
  char *local_20;
  size_t local_18;
  
  local_28 = this->webLinkId;
  this_00 = http::std::
            map<unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
            ::at(&this->webFront->webLinks,&local_28);
  local_28 = 0x102;
  local_26 = script._M_len._1_1_;
  local_25 = (undefined1)script._M_len;
  local_20 = script._M_str;
  local_18 = script._M_len;
  websocket::WebSocket<webfront::networking::TCPNetworkingTS>::write
            (&this_00->ws,(int)&local_28,(void *)0x4,(size_t)script._M_str);
  return;
}

Assistant:

void addScript(std::string_view script) const {
        try {
            webFront.getLink(webLinkId).sendCommand(msg::TextCommand(msg::TxtOpcode::injectScript, script));
        }
        catch (const std::out_of_range&) {
            throw ConnectionError("Connection with client lost");
        }
    }